

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

NodeAVL * avlRotateLeft(NodeAVL *q)

{
  NodeAVL *pNVar1;
  NodeAVL *in_RDI;
  NodeAVL *qp;
  NodeAVL *p;
  NodeAVL *nd;
  
  nd = in_RDI->right;
  in_RDI->right = nd->left;
  if (nd->left != (NodeAVL *)0x0) {
    nd->left->parent = in_RDI;
  }
  nd->left = in_RDI;
  pNVar1 = in_RDI->parent;
  in_RDI->parent = nd;
  nd->parent = pNVar1;
  avlFixHeight(nd);
  avlFixHeight(nd);
  return nd;
}

Assistant:

static
NodeAVL* avlRotateLeft( NodeAVL* q ){
    #ifdef DEBUG_AVL
      printf( "avlRotateLeft id=%d\n", q->id );
    #endif
    NodeAVL* p = q->right;
    q->right = p->left;
    if( p->left ) p->left->parent = q;
    p->left = q;
    NodeAVL* qp = q->parent;
    q->parent = p;
    p->parent = qp;
    avlFixHeight(q);
    avlFixHeight(p);
    return p;
}